

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

string * cmSystemTools::FileExistsInParentDirectories
                   (string *__return_storage_ptr__,string *fname,string *directory,string *toplevel)

{
  bool bVar1;
  string dir;
  string prevDir;
  string file;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  std::__cxx11::string::string((string *)&local_b0,(string *)fname);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_b0);
  std::__cxx11::string::string((string *)&local_f0,(string *)directory);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_f0);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  do {
    bVar1 = std::operator!=(&local_f0,&local_d0);
    if (!bVar1) {
LAB_00111e30:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_90);
LAB_00111e44:
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_b0);
      return __return_storage_ptr__;
    }
    local_90.View_._M_len = local_f0._M_string_length;
    local_90.View_._M_str = local_f0._M_dataplus._M_p;
    local_60.View_._M_len = 1;
    local_60.View_._M_str = "/";
    cmStrCat<std::__cxx11::string>(__return_storage_ptr__,&local_90,&local_60,&local_b0);
    bVar1 = cmsys::SystemTools::FileExists(__return_storage_ptr__);
    if (bVar1) goto LAB_00111e44;
    if (local_f0._M_string_length < toplevel->_M_string_length) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      goto LAB_00111e30;
    }
    std::__cxx11::string::_M_assign((string *)&local_d0);
    cmsys::SystemTools::GetParentDirectory((string *)&local_90,&local_f0);
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  } while( true );
}

Assistant:

std::string cmSystemTools::FileExistsInParentDirectories(
  const std::string& fname, const std::string& directory,
  const std::string& toplevel)
{
  std::string file = fname;
  cmSystemTools::ConvertToUnixSlashes(file);
  std::string dir = directory;
  cmSystemTools::ConvertToUnixSlashes(dir);
  std::string prevDir;
  while (dir != prevDir) {
    std::string path = cmStrCat(dir, "/", file);
    if (cmSystemTools::FileExists(path)) {
      return path;
    }
    if (dir.size() < toplevel.size()) {
      break;
    }
    prevDir = dir;
    dir = cmSystemTools::GetParentDirectory(dir);
  }
  return "";
}